

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

string * __thiscall Tokens::pop_abi_cxx11_(string *__return_storage_ptr__,Tokens *this)

{
  size_type __n;
  reference pvVar1;
  
  __n = this->fIndex;
  this->fIndex = __n + 1;
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&this->fTokens,__n);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string pop() {
		return std::move(fTokens.at(fIndex++));
	}